

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O2

int CfdGetPsbtPubkeyListBip32Data
              (void *handle,void *pubkey_list_handle,uint32_t index,char **pubkey,char **fingerprint
              ,char **bip32_path)

{
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *this;
  reference pvVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  CfdException *pCVar5;
  char *work_pubkey;
  string local_220;
  char *work_fingerprint;
  undefined8 local_1f8;
  ExtPubkey local_1f0;
  value_type key;
  
  work_fingerprint = (char *)0x0;
  local_1f8 = 0;
  cfd::Initialize();
  std::__cxx11::string::string((string *)&key,"PsbtPubkeyList",(allocator *)&local_1f0);
  cfd::capi::CheckBuffer(pubkey_list_handle,(string *)&key);
  std::__cxx11::string::~string((string *)&key);
  if (pubkey == (char **)0x0) {
    key.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = "cfdcapi_psbt.cpp";
    key.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x763;
    key.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = "CfdGetPsbtPubkeyListBip32Data";
    cfd::core::logger::warn<>((CfdSourceLocation *)&key,"pubkey is null.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&key,"Failed to parameter. pubkey is null.",(allocator *)&local_1f0);
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&key);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  this = *(vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> **)
          ((long)pubkey_list_handle + 0x18);
  if (this == (vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)0x0) {
    key.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = "cfdcapi_psbt.cpp";
    key.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x769;
    key.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = "CfdGetPsbtPubkeyListBip32Data";
    cfd::core::logger::warn<>((CfdSourceLocation *)&key,"key_list is null.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&key,"Failed to handle statement. key_list is null.",
               (allocator *)&local_1f0);
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalStateError,(string *)&key);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if ((ulong)(((long)(this->
                     super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->
                    super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>).
                    _M_impl.super__Vector_impl_data._M_start) / 0x150) <= (ulong)index) {
    key.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = "cfdcapi_psbt.cpp";
    key.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x76f;
    key.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = "CfdGetPsbtPubkeyListBip32Data";
    cfd::core::logger::warn<>((CfdSourceLocation *)&key,"out of range error.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)&key,"Failed to out of range.",(allocator *)&local_1f0);
    cfd::core::CfdException::CfdException(pCVar5,kCfdOutOfRangeError,(string *)&key);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (*(char *)((long)pubkey_list_handle + 0x10) != '\0') {
    pvVar1 = std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::at
                       (this,(ulong)index);
    cfd::core::KeyData::KeyData(&key,pvVar1);
    if (*(char *)((long)pubkey_list_handle + 0x11) == '\x01') {
      cfd::core::KeyData::GetExtPubkey(&local_1f0,&key);
      cfd::core::ExtPubkey::ToString_abi_cxx11_(&local_220,&local_1f0);
      pcVar2 = cfd::capi::CreateString(&local_220);
      std::__cxx11::string::~string((string *)&local_220);
      cfd::core::ExtPubkey::~ExtPubkey(&local_1f0);
    }
    else {
      cfd::core::KeyData::GetPubkey((Pubkey *)&local_220,&key);
      cfd::core::Pubkey::GetHex_abi_cxx11_((string *)&local_1f0,(Pubkey *)&local_220);
      pcVar2 = cfd::capi::CreateString((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_220);
    }
    if (fingerprint == (char **)0x0) {
      pcVar3 = (char *)0x0;
    }
    else {
      cfd::core::KeyData::GetFingerprint((ByteData *)&local_220,&key);
      cfd::core::ByteData::GetHex_abi_cxx11_((string *)&local_1f0,(ByteData *)&local_220);
      pcVar3 = cfd::capi::CreateString((string *)&local_1f0);
      work_fingerprint = pcVar3;
      std::__cxx11::string::~string((string *)&local_1f0);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_220);
    }
    if (bip32_path == (char **)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      cfd::core::KeyData::GetBip32Path_abi_cxx11_((string *)&local_1f0,&key,kApostrophe,false);
      pcVar4 = cfd::capi::CreateString((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_1f0);
    }
    *pubkey = pcVar2;
    if (fingerprint != (char **)0x0) {
      *fingerprint = pcVar3;
    }
    if (bip32_path != (char **)0x0) {
      *bip32_path = pcVar4;
    }
    cfd::core::KeyData::~KeyData(&key);
    return 0;
  }
  key.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "cfdcapi_psbt.cpp";
  key.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0x774;
  key.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = "CfdGetPsbtPubkeyListBip32Data";
  cfd::core::logger::warn<>((CfdSourceLocation *)&key,"bip32 not support error.");
  pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&key,"Failed to bip32 not support.",(allocator *)&local_1f0);
  cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&key);
  __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetPsbtPubkeyListBip32Data(
    void* handle, void* pubkey_list_handle, uint32_t index, char** pubkey,
    char** fingerprint, char** bip32_path) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_pubkey = nullptr;
  char* work_fingerprint = nullptr;
  char* work_path = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(pubkey_list_handle, kPrefixPsbtPubkeyList);
    CfdCapiPsbtPubkeyListHandle* list_handle =
        static_cast<CfdCapiPsbtPubkeyListHandle*>(pubkey_list_handle);
    if (pubkey == nullptr) {
      warn(CFD_LOG_SOURCE, "pubkey is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null.");
    }
    if (list_handle->key_list == nullptr) {
      warn(CFD_LOG_SOURCE, "key_list is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. key_list is null.");
    }
    if (index >= list_handle->key_list->size()) {
      warn(CFD_LOG_SOURCE, "out of range error.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError, "Failed to out of range.");
    }
    if (!list_handle->has_bip32_list) {
      warn(CFD_LOG_SOURCE, "bip32 not support error.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Failed to bip32 not support.");
    }

    auto key = list_handle->key_list->at(index);
    if (list_handle->has_xpub_list) {
      work_pubkey = CreateString(key.GetExtPubkey().ToString());
    } else {
      work_pubkey = CreateString(key.GetPubkey().GetHex());
    }
    if (fingerprint != nullptr) {
      work_fingerprint = CreateString(key.GetFingerprint().GetHex());
    }
    if (bip32_path != nullptr) work_path = CreateString(key.GetBip32Path());

    *pubkey = work_pubkey;
    if (fingerprint != nullptr) *fingerprint = work_fingerprint;
    if (bip32_path != nullptr) *bip32_path = work_path;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_pubkey, &work_fingerprint, &work_path);
  return result;
}